

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian-white-noise.cpp
# Opt level: O0

void __thiscall
stateObservation::GaussianWhiteNoise::setDimension(GaussianWhiteNoise *this,uint dim)

{
  IdentityReturnType local_48;
  ConstantReturnType local_30;
  uint local_14;
  GaussianWhiteNoise *pGStack_10;
  uint dim_local;
  GaussianWhiteNoise *this_local;
  
  this->dim_ = dim;
  local_14 = dim;
  pGStack_10 = this;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_30,(ulong)dim,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)&this->bias_,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_30);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            (&local_48,(ulong)local_14,(ulong)local_14);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)&this->std_,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_48);
  return;
}

Assistant:

void GaussianWhiteNoise::setDimension(unsigned dim)
    {
        dim_=dim;
        bias_=Vector::Zero(dim,1);
        std_=Matrix::Identity(dim, dim);
    }